

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

float BinaryenConstGetValueF32(BinaryenExpressionRef expr)

{
  bool bVar1;
  float fVar2;
  Expression *expression;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xae7,"float BinaryenConstGetValueF32(BinaryenExpressionRef)");
  }
  fVar2 = wasm::Literal::getf32((Literal *)(expr + 1));
  return fVar2;
}

Assistant:

float BinaryenConstGetValueF32(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return static_cast<Const*>(expression)->value.getf32();
}